

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_while_loop_initializers(CompilerGLSL *this,SPIRBlock *block)

{
  uint32_t id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  SPIRVariable *local_40;
  SPIRVariable *var;
  TypedID<(spirv_cross::Types)2> *loop_var;
  TypedID<(spirv_cross::Types)2> *__end1;
  TypedID<(spirv_cross::Types)2> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *__range1;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  
  __begin1 = (TypedID<(spirv_cross::Types)2> *)&block->loop_variables;
  __range1 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)block;
  block_local = (SPIRBlock *)this;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin1);
  loop_var = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::end
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_> *)__begin1);
  for (; __end1 != loop_var; __end1 = __end1 + 1) {
    var = (SPIRVariable *)__end1;
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    local_40 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
    (*(this->super_Compiler)._vptr_Compiler[0x27])(local_60,this,local_40);
    statement<std::__cxx11::string,char_const(&)[2]>(this,local_60,(char (*) [2])0x5e9b70);
    ::std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_while_loop_initializers(const SPIRBlock &block)
{
	// While loops do not take initializers, so declare all of them outside.
	for (auto &loop_var : block.loop_variables)
	{
		auto &var = get<SPIRVariable>(loop_var);
		statement(variable_decl(var), ";");
	}
}